

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::DispatchComputeIndirect
          (DeviceContextGLImpl *this,DispatchComputeIndirectAttribs *Attribs)

{
  GLContextState *State;
  byte bVar1;
  BufferGLImpl *this_00;
  GLenum err;
  string msg;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DispatchComputeIndirect
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  State = &this->m_ContextState;
  PipelineStateGLImpl::CommitProgram
            ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
             m_pObject,State);
  bVar1 = DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::GetCommitMask
                    (&(this->m_BindInfo).super_CommittedShaderResources,false);
  if (bVar1 != 0) {
    BindProgramResources(this,(uint)bVar1);
  }
  DvpValidateCommittedShaderResources(this);
  this_00 = ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>(Attribs->pAttribsBuffer);
  BufferGLImpl::BufferMemoryBarrier(this_00,MEMORY_BARRIER_INDIRECT_BUFFER,State);
  GLContextState::BindBuffer(State,0x90ee,&this_00->m_GlBuffer,false);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[54],char[17],unsigned_int>
              (false,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57b,(char (*) [54])"Failed to bind a buffer for dispatch indirect command",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57b);
    std::__cxx11::string::~string((string *)&msg);
  }
  (*__glewDispatchComputeIndirect)(Attribs->DispatchArgsByteOffset);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[35],char[17],unsigned_int>
              (false,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57e,(char (*) [35])"glDispatchComputeIndirect() failed",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DispatchComputeIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x57e);
    std::__cxx11::string::~string((string *)&msg);
  }
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length._0_4_ = 0;
  GLContextState::BindBuffer(State,0x90ee,(GLBufferObj *)&msg,false);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)&msg);
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::DispatchComputeIndirect(const DispatchComputeIndirectAttribs& Attribs)
{
    TDeviceContextBase::DispatchComputeIndirect(Attribs, 0);

#if GL_ARB_compute_shader
    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask())
    {
        BindProgramResources(BindSRBMask);
    }

#    ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#    endif

    BufferGLImpl* pBufferGL = ClassPtrCast<BufferGLImpl>(Attribs.pAttribsBuffer);
    pBufferGL->BufferMemoryBarrier(
        MEMORY_BARRIER_INDIRECT_BUFFER, // Command data sourced from buffer objects by
                                        // Draw*Indirect and DispatchComputeIndirect commands after the barrier
                                        // will reflect data written by shaders prior to the barrier.The buffer
                                        // objects affected by this bit are derived from the DRAW_INDIRECT_BUFFER
                                        // and DISPATCH_INDIRECT_BUFFER bindings.
        m_ContextState);

    constexpr bool ResetVAO = false; // GL_DISPATCH_INDIRECT_BUFFER does not affect VAO
    m_ContextState.BindBuffer(GL_DISPATCH_INDIRECT_BUFFER, pBufferGL->m_GlBuffer, ResetVAO);
    DEV_CHECK_GL_ERROR("Failed to bind a buffer for dispatch indirect command");

    glDispatchComputeIndirect(StaticCast<GLintptr>(Attribs.DispatchArgsByteOffset));
    DEV_CHECK_GL_ERROR("glDispatchComputeIndirect() failed");

    m_ContextState.BindBuffer(GL_DISPATCH_INDIRECT_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);

    PostDraw();
#else
    UNSUPPORTED("Compute shaders are not supported");
#endif
}